

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fasttext.cc
# Opt level: O3

vector<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
* __thiscall
fasttext::FastText::getAnalogies
          (vector<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           *__return_storage_ptr__,FastText *this,int32_t k,string *wordA,string *wordB,
          string *wordC)

{
  DenseMatrix *wordVectors;
  pointer pcVar1;
  long *plVar2;
  long lVar3;
  real rVar4;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  Vector buffer;
  Vector query;
  allocator_type local_ea;
  less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> local_e9;
  Vector local_e8;
  int32_t local_d4;
  Vector local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  undefined1 *local_a0 [2];
  undefined1 local_90 [16];
  long *local_80 [2];
  long local_70 [2];
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_60;
  
  local_d4 = k;
  Vector::Vector(&local_d0,
                 (long)((this->args_).super___shared_ptr<fasttext::Args,_(__gnu_cxx::_Lock_policy)2>
                       ._M_ptr)->dim);
  Vector::zero(&local_d0);
  Vector::Vector(&local_e8,
                 (long)((this->args_).super___shared_ptr<fasttext::Args,_(__gnu_cxx::_Lock_policy)2>
                       ._M_ptr)->dim);
  getWordVector(this,&local_e8,wordA);
  rVar4 = Vector::norm(&local_e8);
  Vector::addVector(&local_d0,&local_e8,1.0 / (rVar4 + 1e-08));
  getWordVector(this,&local_e8,wordB);
  rVar4 = Vector::norm(&local_e8);
  Vector::addVector(&local_d0,&local_e8,-1.0 / (rVar4 + 1e-08));
  getWordVector(this,&local_e8,wordC);
  rVar4 = Vector::norm(&local_e8);
  Vector::addVector(&local_d0,&local_e8,1.0 / (rVar4 + 1e-08));
  lazyComputeWordVectors(this);
  wordVectors = (this->wordVectors_)._M_t.
                super___uniq_ptr_impl<fasttext::DenseMatrix,_std::default_delete<fasttext::DenseMatrix>_>
                ._M_t.
                super__Tuple_impl<0UL,_fasttext::DenseMatrix_*,_std::default_delete<fasttext::DenseMatrix>_>
                .super__Head_base<0UL,_fasttext::DenseMatrix_*,_false>._M_head_impl;
  if (wordVectors != (DenseMatrix *)0x0) {
    local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
    pcVar1 = (wordA->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_c0,pcVar1,pcVar1 + wordA->_M_string_length);
    local_a0[0] = local_90;
    pcVar1 = (wordB->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_a0,pcVar1,pcVar1 + wordB->_M_string_length);
    plVar2 = local_70;
    pcVar1 = (wordC->_M_dataplus)._M_p;
    local_80[0] = plVar2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_80,pcVar1,pcVar1 + wordC->_M_string_length);
    __l._M_len = 3;
    __l._M_array = &local_c0;
    std::
    set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *)&local_60,__l,&local_e9,&local_ea);
    getNN(__return_storage_ptr__,this,wordVectors,&local_d0,local_d4,
          (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *)&local_60);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~_Rb_tree(&local_60);
    lVar3 = -0x60;
    do {
      if (plVar2 != (long *)plVar2[-2]) {
        operator_delete((long *)plVar2[-2],*plVar2 + 1);
      }
      plVar2 = plVar2 + -4;
      lVar3 = lVar3 + 0x20;
    } while (lVar3 != 0);
    free(local_e8.data_.mem_);
    free(local_d0.data_.mem_);
    return __return_storage_ptr__;
  }
  __assert_fail("wordVectors_",
                "/workspace/llm4binary/github/license_c_cmakelists/facebookresearch[P]fastText/src/fasttext.cc"
                ,0x270,
                "std::vector<std::pair<real, std::string>> fasttext::FastText::getAnalogies(int32_t, const std::string &, const std::string &, const std::string &)"
               );
}

Assistant:

std::vector<std::pair<real, std::string>> FastText::getAnalogies(
    int32_t k,
    const std::string& wordA,
    const std::string& wordB,
    const std::string& wordC) {
  Vector query(args_->dim);
  query.zero();

  Vector buffer(args_->dim);
  getWordVector(buffer, wordA);
  query.addVector(buffer, 1.0 / (buffer.norm() + 1e-8));
  getWordVector(buffer, wordB);
  query.addVector(buffer, -1.0 / (buffer.norm() + 1e-8));
  getWordVector(buffer, wordC);
  query.addVector(buffer, 1.0 / (buffer.norm() + 1e-8));

  lazyComputeWordVectors();
  assert(wordVectors_);
  return getNN(*wordVectors_, query, k, {wordA, wordB, wordC});
}